

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_data(basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_list<std::__cxx11::basic_string<char>_> *l)

{
  vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  basic_list<std::__cxx11::basic_string<char>_> *l_local;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->type_ = list;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>,std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>>
  ::
  unique_ptr<std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>,void>
            ((unique_ptr<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>,std::default_delete<std::unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>>>
              *)&this->obj_);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->str_);
  std::
  unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>,void>
            ((unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>,std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::string>,std::allocator<kainjow::mustache::basic_data<std::__cxx11::string>>>>>
              *)&this->list_);
  std::
  unique_ptr<std::function<std::__cxx11::string()>,std::default_delete<std::function<std::__cxx11::string()>>>
  ::unique_ptr<std::default_delete<std::function<std::__cxx11::string()>>,void>
            ((unique_ptr<std::function<std::__cxx11::string()>,std::default_delete<std::function<std::__cxx11::string()>>>
              *)&this->partial_);
  std::
  unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::string>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>>
  ::unique_ptr<std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>,void>
            ((unique_ptr<kainjow::mustache::basic_lambda_t<std::__cxx11::string>,std::default_delete<kainjow::mustache::basic_lambda_t<std::__cxx11::string>>>
              *)&this->lambda_);
  this_00 = (vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)operator_new(0x18);
  Catch::clara::std::
  vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(this_00,l);
  Catch::clara::std::
  unique_ptr<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::reset(&this->list_,this_00);
  return;
}

Assistant:

basic_data(const basic_list<string_type>& l) : type_{type::list} {
        list_.reset(new basic_list<string_type>(l));
    }